

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadlib.c
# Opt level: O3

char * findfile(lua_State *L,char *name,char *pname,char *dirsep)

{
  char *pcVar1;
  
  lua_getfield(L,-0xf4629,pname);
  pcVar1 = lua_tolstring(L,-1,(size_t *)0x0);
  if (pcVar1 == (char *)0x0) {
    luaL_error(L,"\'package.%s\' must be a string",pname);
    pcVar1 = (char *)0x0;
  }
  pcVar1 = searchpath(L,name,pcVar1,".","/");
  return pcVar1;
}

Assistant:

static const char *findfile (lua_State *L, const char *name,
                                           const char *pname,
                                           const char *dirsep) {
  const char *path;
  lua_getfield(L, lua_upvalueindex(1), pname);
  path = lua_tostring(L, -1);
  if (l_unlikely(path == NULL))
    luaL_error(L, "'package.%s' must be a string", pname);
  return searchpath(L, name, path, ".", dirsep);
}